

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_str * sqlite3_str_new(sqlite3 *db)

{
  int local_24;
  sqlite3_str *local_18;
  sqlite3_str *p;
  sqlite3 *db_local;
  
  local_18 = (sqlite3_str *)sqlite3_malloc64(0x20);
  if (local_18 == (StrAccum *)0x0) {
    local_18 = &sqlite3OomStr;
  }
  else {
    if (db == (sqlite3 *)0x0) {
      local_24 = 1000000000;
    }
    else {
      local_24 = db->aLimit[0];
    }
    sqlite3StrAccumInit(local_18,(sqlite3 *)0x0,(char *)0x0,0,local_24);
  }
  return local_18;
}

Assistant:

SQLITE_API sqlite3_str *sqlite3_str_new(sqlite3 *db){
  sqlite3_str *p = sqlite3_malloc64(sizeof(*p));
  if( p ){
    sqlite3StrAccumInit(p, 0, 0, 0,
            db ? db->aLimit[SQLITE_LIMIT_LENGTH] : SQLITE_MAX_LENGTH);
  }else{
    p = &sqlite3OomStr;
  }
  return p;
}